

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basestrategy.h
# Opt level: O0

void __thiscall
hedg::Base_Strategy::send_back_order
          (Base_Strategy *this,vector<hedg::Order,_std::allocator<hedg::Order>_> *orders)

{
  vector<hedg::Order,_std::allocator<hedg::Order>_> *orders_;
  pointer this_00;
  system_error e;
  string local_d0;
  string local_a0;
  place_order<hedg::Back> local_80;
  vector<hedg::Order,_std::allocator<hedg::Order>_> *local_18;
  vector<hedg::Order,_std::allocator<hedg::Order>_> *orders_local;
  Base_Strategy *this_local;
  
  local_18 = orders;
  orders_local = (vector<hedg::Order,_std::allocator<hedg::Order>_> *)this;
  this_00 = std::
            unique_ptr<hedg::Client<hedg::Rest_Client>,_std::default_delete<hedg::Client<hedg::Rest_Client>_>_>
            ::operator->(&this->client_);
  std::__cxx11::string::string((string *)&local_a0,(string *)&this->session_id_);
  std::__cxx11::string::string((string *)&local_d0,(string *)&this->market_id_);
  orders_ = local_18;
  std::__cxx11::string::string
            ((string *)(e.m_what.field_2._M_local_buf + 8),
             (string *)config::place_order_endpoint_abi_cxx11_);
  params::place_order<hedg::Back>::place_order
            (&local_80,&local_a0,&local_d0,orders_,(string *)((long)&e.m_what.field_2 + 8));
  Client<hedg::Rest_Client>::
  send_request<boost::beast::http::message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>,hedg::params::place_order<hedg::Back>>
            (this_00,rest::message<hedg::params::place_order<hedg::Back>>,&local_80);
  params::place_order<hedg::Back>::~place_order(&local_80);
  std::__cxx11::string::~string((string *)(e.m_what.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_a0);
  return;
}

Assistant:

void send_back_order(std::vector<Order>& orders) {
		try {
			client_->send_request(rest::message<params::place_order<Back> >,
				params::place_order<Back>(session_id_, market_id_, orders));
		}
		catch (boost::system::system_error e) {
			spdlog::error(e.what());
			spdlog::warn("Unable to send back order");
		}

	}